

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::AppendParams
          (iuCsvFileParamsGenerator<int> *this,params_t *params,string *data)

{
  byte bVar1;
  iterator __position;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int param;
  int local_c;
  
  if (data->_M_string_length != 0) {
    pbVar4 = (byte *)(data->_M_dataplus)._M_p;
    pbVar3 = pbVar4 + data->_M_string_length;
    do {
      bVar1 = *pbVar4;
      if (bVar1 < 0xd) {
        if (bVar1 != 9) {
          if (bVar1 == 10) {
LAB_001224d7:
            pbVar4 = pbVar4 + 1;
          }
          goto LAB_001224da;
        }
LAB_001224e6:
        pbVar4 = pbVar4 + 1;
      }
      else {
        if (bVar1 == 0x20) goto LAB_001224e6;
        if (bVar1 == 0xd) goto LAB_001224d7;
LAB_001224da:
        if ((bVar1 != 0xd) && (bVar1 != 10)) {
          bVar2 = StringToValue<int>(data,&local_c);
          if (!bVar2) {
            return;
          }
          __position._M_current =
               (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *__position._M_current = local_c;
            (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
            return;
          }
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)params,__position,&local_c);
          return;
        }
      }
    } while (pbVar4 != pbVar3);
  }
  return;
}

Assistant:

void AppendParams(params_t& params, const ::std::string& data)
    {
        if( StringIsBlank(data) )
        {
            return;
        }
        T param;
        if( !StringToValue(data, param) )
        {
            return;
        }
        params.push_back(param);
    }